

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

void __thiscall QIconLoader::setThemeName(QIconLoader *this,QString *themeName)

{
  long lVar1;
  bool bVar2;
  QDebug *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_50;
  char *local_38;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::comparesEqual(&this->m_userTheme,themeName);
  if (!bVar2) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_50.d._0_4_ = 2;
      local_50._4_8_ = 0;
      local_50._12_8_ = 0;
      local_50.size._4_4_ = 0;
      local_38 = lcIconLoader::category.name;
      QMessageLogger::debug();
      this_00 = QDebug::operator<<(&local_30,"Setting user theme name to");
      QDebug::operator<<(this_00,themeName);
      QDebug::~QDebug(&local_30);
    }
    lVar1 = (this->m_userTheme).d.size;
    QString::operator=(&this->m_userTheme,(QString *)themeName);
    if ((lVar1 != 0) && ((this->m_userTheme).d.size == 0)) {
      systemIconSearchPaths();
      setThemeSearchPath(this,(QStringList *)&local_50);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
    }
    this->m_themeKey = this->m_themeKey + 1;
    if ((this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
        super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged == true) {
      (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconLoader::setThemeName(const QString &themeName)
{
    if (m_userTheme == themeName)
        return;

    qCDebug(lcIconLoader) << "Setting user theme name to" << themeName;

    const bool hadUserTheme = hasUserTheme();
    m_userTheme = themeName;
    // if we cleared the user theme, then reset search paths as well,
    // otherwise we'll keep looking in the user-defined search paths for
    // a system-provide theme, which will never work.
    if (!hasUserTheme() && hadUserTheme)
        setThemeSearchPath(systemIconSearchPaths());
    invalidateKey();
}